

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::DataSourceDescriptor::operator==
          (DataSourceDescriptor *this,DataSourceDescriptor *other)

{
  __type_conflict4 _Var1;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    if ((((_Var1) && (this->id_ == other->id_)) &&
        (this->will_notify_on_stop_ == other->will_notify_on_stop_)) &&
       ((this->will_notify_on_start_ == other->will_notify_on_start_ &&
        (this->handles_incremental_state_clear_ == other->handles_incremental_state_clear_)))) {
      _Var1 = ::std::operator==(&this->gpu_counter_descriptor_,&other->gpu_counter_descriptor_);
      if (_Var1) {
        _Var1 = ::std::operator==(&this->track_event_descriptor_,&other->track_event_descriptor_);
        if (_Var1) {
          _Var1 = ::std::operator==(&this->ftrace_descriptor_,&other->ftrace_descriptor_);
          return _Var1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool DataSourceDescriptor::operator==(const DataSourceDescriptor& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && id_ == other.id_
   && will_notify_on_stop_ == other.will_notify_on_stop_
   && will_notify_on_start_ == other.will_notify_on_start_
   && handles_incremental_state_clear_ == other.handles_incremental_state_clear_
   && gpu_counter_descriptor_ == other.gpu_counter_descriptor_
   && track_event_descriptor_ == other.track_event_descriptor_
   && ftrace_descriptor_ == other.ftrace_descriptor_;
}